

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::variable_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRVariable *variable)

{
  uint id;
  bool bVar1;
  uint32_t uVar2;
  SPIRType *type;
  ulong uVar3;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  type = Compiler::get_variable_data_type(&this->super_Compiler,variable);
  if (1 < type->pointer_depth) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&sStack_88,"Cannot declare pointer-to-pointer types.",
               (allocator *)&local_68);
    CompilerError::CompilerError(this_00,&sStack_88);
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x2b])
            (&sStack_88,this,(ulong)(variable->super_IVariant).self.id);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&local_48,this,(ulong)(variable->super_IVariant).self.id,1);
  pbVar4 = &local_48;
  (*(this->super_Compiler)._vptr_Compiler[0x1a])
            (&local_68,this,type,pbVar4,(ulong)(variable->super_IVariant).self.id);
  join<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&sStack_88,&local_68,pbVar4);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&sStack_88);
  if (variable->loop_variable == true) {
    id = (variable->static_expression).id;
    if ((ulong)id != 0) {
      if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id].type ==
          TypeUndef) {
        if ((this->options).force_zero_initialized_variables != true) {
          return __return_storage_ptr__;
        }
        bVar1 = type_can_zero_initialize(this,type);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        uVar2 = Compiler::get_variable_data_type_id(&this->super_Compiler,variable);
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this->super_Compiler)._vptr_Compiler;
        (**(code **)((long)&pbVar4[0xc].field_2 + 8))(&local_68,this,uVar2);
        join<char_const(&)[4],std::__cxx11::string>
                  (&sStack_88,(spirv_cross *)0x31e8c7,(char (*) [4])&local_68,pbVar4);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        to_expression_abi_cxx11_(&local_68,this,id,true);
        join<char_const(&)[4],std::__cxx11::string>
                  (&sStack_88,(spirv_cross *)0x31e8c7,(char (*) [4])&local_68,pbVar4);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      goto LAB_0022d31f;
    }
  }
  uVar3 = (ulong)(variable->initializer).id;
  if (uVar3 == 0) {
    return __return_storage_ptr__;
  }
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (*(int *)((long)&pbVar4->field_2 + uVar3 * 0x18) == 0xc) {
    if ((this->options).force_zero_initialized_variables != true) {
      return __return_storage_ptr__;
    }
    bVar1 = type_can_zero_initialize(this,type);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    uVar2 = Compiler::get_variable_data_type_id(&this->super_Compiler,variable);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (this->super_Compiler)._vptr_Compiler;
    (**(code **)((long)&pbVar4[0xc].field_2 + 8))(&local_68,this,uVar2);
    join<char_const(&)[4],std::__cxx11::string>
              (&sStack_88,(spirv_cross *)0x31e8c7,(char (*) [4])&local_68,pbVar4);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x32])(&local_68,this,variable);
    join<char_const(&)[4],std::__cxx11::string>
              (&sStack_88,(spirv_cross *)0x31e8c7,(char (*) [4])&local_68,pbVar4);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
LAB_0022d31f:
  ::std::__cxx11::string::~string((string *)&sStack_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::variable_decl(const SPIRVariable &variable)
{
	// Ignore the pointer type since GLSL doesn't have pointers.
	auto &type = get_variable_data_type(variable);

	if (type.pointer_depth > 1)
		SPIRV_CROSS_THROW("Cannot declare pointer-to-pointer types.");

	auto res = join(to_qualifiers_glsl(variable.self), variable_decl(type, to_name(variable.self), variable.self));

	if (variable.loop_variable && variable.static_expression)
	{
		uint32_t expr = variable.static_expression;
		if (ir.ids[expr].get_type() != TypeUndef)
			res += join(" = ", to_expression(variable.static_expression));
		else if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			res += join(" = ", to_zero_initialized_expression(get_variable_data_type_id(variable)));
	}
	else if (variable.initializer)
	{
		uint32_t expr = variable.initializer;
		if (ir.ids[expr].get_type() != TypeUndef)
			res += join(" = ", to_initializer_expression(variable));
		else if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			res += join(" = ", to_zero_initialized_expression(get_variable_data_type_id(variable)));
	}

	return res;
}